

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O3

uint32 __thiscall Clasp::StatisticObject::size(StatisticObject *this)

{
  E EVar1;
  code *UNRECOVERED_JUMPTABLE;
  uint32 uVar2;
  reference ppIVar3;
  void *pvVar4;
  
  if (this->handle_ != 0) {
    ppIVar3 = bk_lib::
              pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
              ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                    *)types_s,(uint)(ushort)(this->handle_ >> 0x30));
    EVar1 = ((*ppIVar3)->type).val_;
    if (Value < EVar1) {
      if (EVar1 - Array < 2) {
        ppIVar3 = bk_lib::
                  pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                  ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                        *)types_s,(uint)*(ushort *)((long)&this->handle_ + 6));
        UNRECOVERED_JUMPTABLE = *(code **)(*ppIVar3 + 2);
        pvVar4 = self(this);
        uVar2 = (*UNRECOVERED_JUMPTABLE)(pvVar4);
        return uVar2;
      }
      Potassco::fail(-2,"uint32 Clasp::StatisticObject::size() const",0x42,"false","invalid object",
                     0);
    }
  }
  return 0;
}

Assistant:

uint32 StatisticObject::size() const {
	switch (type()) {
		default: POTASSCO_REQUIRE(false, "invalid object");
		case Potassco::Statistics_t::Empty: return 0;
		case Potassco::Statistics_t::Value: return 0;
		case Potassco::Statistics_t::Map:   return static_cast<const M*>(tid())->size(self());
		case Potassco::Statistics_t::Array: return static_cast<const A*>(tid())->size(self());
	}
}